

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

ion_err_t dictionary_create(ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                           ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                           ion_value_size_t value_size,ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  ion_dictionary_status_t iVar2;
  code *pcVar3;
  
  if (key_type - key_type_numeric_unsigned < 3) {
    pcVar3 = (code *)(&PTR_dictionary_compare_unsigned_value_00113dd8)
                     [key_type - key_type_numeric_unsigned];
  }
  else {
    pcVar3 = dictionary_compare_signed_value;
  }
  iVar1 = (*handler->create_dictionary)
                    (id,key_type,key_size,value_size,dictionary_size,pcVar3,handler,dictionary);
  iVar2 = '\x02';
  if (iVar1 == '\0') {
    dictionary->instance->id = id;
    iVar2 = '\0';
  }
  dictionary->status = iVar2;
  return iVar1;
}

Assistant:

ion_err_t
dictionary_create(
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary,
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size
) {
	ion_err_t					err;
	ion_dictionary_compare_t	compare = dictionary_switch_compare(key_type);

	err = handler->create_dictionary(id, key_type, key_size, value_size, dictionary_size, compare, handler, dictionary);

	if (err_ok == err) {
		dictionary->instance->id	= id;
		dictionary->status			= ion_dictionary_status_ok;
	}
	else {
		dictionary->status = ion_dictionary_status_error;
	}

	return err;
}